

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<Flood_One_Test>::CreateTest
          (TestFactoryImpl<Flood_One_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  *(undefined1 *)&this_00[1]._vptr_Test = 0;
  *(undefined4 *)((long)&this_00[1]._vptr_Test + 1) = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_00197c60;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }